

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O2

void __thiscall
btDbvt::rayTestInternal
          (btDbvt *this,btDbvtNode *root,btVector3 *rayFrom,btVector3 *rayTo,
          btVector3 *rayDirectionInverse,uint *signs,btScalar lambda_max,btVector3 *aabbMin,
          btVector3 *aabbMax,ICollide *policy)

{
  btDbvtNode *v1;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int iVar4;
  int local_7c;
  btScalar tmin;
  btAlignedObjectArray<const_btDbvtNode_*> *local_70;
  uint *local_68;
  btDbvtNode *local_60;
  btVector3 local_58;
  btScalar local_48 [4];
  
  if (root != (btDbvtNode *)0x0) {
    local_70 = &this->m_rayTestStack;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_58.m_floats._0_8_;
    local_58.m_floats = (btScalar  [4])(auVar1 << 0x40);
    local_68 = signs;
    btAlignedObjectArray<const_btDbvtNode_*>::resize(local_70,0x80,(btDbvtNode **)&local_58);
    *(this->m_rayTestStack).m_data = root;
    iVar3 = 1;
    local_7c = 0x7e;
    do {
      iVar4 = iVar3 + -1;
      v1 = (this->m_rayTestStack).m_data[(long)iVar3 + -1];
      local_58 = operator-((btVector3 *)v1,aabbMax);
      local_48 = (btScalar  [4])operator-(&(v1->volume).mx,aabbMin);
      tmin = 1.0;
      bVar2 = btRayAabb2(rayFrom,rayDirectionInverse,local_68,&local_58,&tmin,0.0,lambda_max);
      if (bVar2) {
        if (*(long *)((long)&v1->field_2 + 8) == 0) {
          (*policy->_vptr_ICollide[3])(policy,v1);
        }
        else {
          if (local_7c < iVar4) {
            local_60 = (btDbvtNode *)0x0;
            btAlignedObjectArray<const_btDbvtNode_*>::resize
                      (local_70,(this->m_rayTestStack).m_size * 2,&local_60);
            local_7c = (this->m_rayTestStack).m_size + -2;
          }
          (this->m_rayTestStack).m_data[(long)iVar3 + -1] = (v1->field_2).childs[0];
          (this->m_rayTestStack).m_data[iVar3] = *(btDbvtNode **)((long)&v1->field_2 + 8);
          iVar4 = iVar3 + 1;
        }
      }
      iVar3 = iVar4;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::rayTestInternal(	const btDbvtNode* root,
								const btVector3& rayFrom,
								const btVector3& rayTo,
								const btVector3& rayDirectionInverse,
								unsigned int signs[3],
								btScalar lambda_max,
								const btVector3& aabbMin,
								const btVector3& aabbMax,
								DBVT_IPOLICY) const
{
        (void) rayTo;
	DBVT_CHECKTYPE
	if(root)
	{
		btVector3 resultNormal;

		int								depth=1;
		int								treshold=DOUBLE_STACKSIZE-2;
		btAlignedObjectArray<const btDbvtNode*>&	stack = m_rayTestStack;
		stack.resize(DOUBLE_STACKSIZE);
		stack[0]=root;
		btVector3 bounds[2];
		do	
		{
			const btDbvtNode*	node=stack[--depth];
			bounds[0] = node->volume.Mins()-aabbMax;
			bounds[1] = node->volume.Maxs()-aabbMin;
			btScalar tmin=1.f,lambda_min=0.f;
			unsigned int result1=false;
			result1 = btRayAabb2(rayFrom,rayDirectionInverse,signs,bounds,tmin,lambda_min,lambda_max);
			if(result1)
			{
				if(node->isinternal())
				{
					if(depth>treshold)
					{
						stack.resize(stack.size()*2);
						treshold=stack.size()-2;
					}
					stack[depth++]=node->childs[0];
					stack[depth++]=node->childs[1];
				}
				else
				{
					policy.Process(node);
				}
			}
		} while(depth);
	}
}